

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  __m128i *palVar15;
  longlong lVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  int iVar24;
  uint uVar25;
  int iVar26;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  undefined8 *puVar27;
  uint uVar28;
  int imm;
  int imm_00;
  int imm_01;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong extraout_RDX_06;
  long lVar31;
  undefined4 in_register_00000084;
  ulong uVar32;
  longlong in_R9;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qa_09;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  longlong extraout_XMM0_Qb_09;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i a_23;
  __m128i a_24;
  __m128i a_25;
  __m128i a_26;
  __m128i a_27;
  __m128i a_28;
  __m128i a_29;
  __m128i a_30;
  __m128i a_31;
  __m128i a_32;
  __m128i a_33;
  __m128i a_34;
  __m128i a_35;
  __m128i a_36;
  __m128i a_37;
  __m128i a_38;
  __m128i a_39;
  __m128i a_40;
  __m128i a_41;
  __m128i a_42;
  __m128i a_43;
  __m128i a_44;
  __m128i a_45;
  __m128i alVar33;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  __m128i b_22;
  __m128i b_23;
  __m128i b_24;
  __m128i b_25;
  __m128i b_26;
  __m128i b_27;
  __m128i b_28;
  __m128i b_29;
  __m128i b_30;
  __m128i b_31;
  __m128i b_32;
  __m128i b_33;
  __m128i b_34;
  __m128i b_35;
  __m128i b_36;
  __m128i b_37;
  __m128i b_38;
  __m128i b_39;
  __m128i b_40;
  __m128i b_41;
  __m128i b_42;
  __m128i b_43;
  __m128i b_44;
  __m128i b_45;
  __m128i b_46;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  __m128i mask_07;
  __m128i mask_08;
  __m128i mask_09;
  __m128i mask_10;
  __m128i mask_11;
  __m128i mask_12;
  __m128i mask_13;
  __m128i mask_14;
  __m128i mask_15;
  __m128i mask_16;
  __m128i mask_17;
  __m128i mask_18;
  __m128i mask_19;
  __m128i mask_20;
  __m128i mask_21;
  __m128i mask_22;
  __m128i mask_23;
  __m128i mask_24;
  __m128i mask_25;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  int32_t in_stack_fffffffffffff208;
  ulong local_df0;
  int local_de8;
  int local_ddc;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t h;
  int local_b10;
  int local_b0c;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m128i vOne;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_950;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_808;
  int iStack_804;
  int iStack_800;
  int iStack_7fc;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  size_t len;
  ulong uVar29;
  longlong lVar30;
  ulong extraout_RDX_07;
  
  uVar32 = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse2_128_32","profile")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse2_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse2_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_scan_profile_sse2_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse2_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_scan_profile_sse2_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_scan_profile_sse2_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_scan_profile_sse2_128_32","gap"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_950 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar5 = profile->matrix;
    iVar24 = (iVar1 + 3) / 4;
    pvVar6 = (profile->profile32).score;
    pvVar7 = (profile->profile32).matches;
    pvVar8 = (profile->profile32).similar;
    if (-open < ppVar5->min) {
      local_ddc = open + -0x80000000;
    }
    else {
      local_ddc = -0x80000000 - ppVar5->min;
    }
    uVar25 = local_ddc + 1;
    iVar26 = 0x7ffffffe - ppVar5->max;
    vNegInfFront[1] = CONCAT44(uVar25,uVar25);
    vSaturationCheckMax[0] = CONCAT44(uVar25,uVar25);
    vSaturationCheckMax[1] = CONCAT44(iVar26,iVar26);
    vSaturationCheckMin[0] = CONCAT44(iVar26,iVar26);
    _mm_insert_epi32_rpl((__m128i)ZEXT416(uVar25),(iVar1 + -1) % iVar24,ppVar5->max);
    profile_local = (parasail_profile_t *)parasail_result_new_table3(iVar24 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4410401;
      uVar28 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar28;
      *(uint *)&profile_local->field_0xc = uVar28;
      b = parasail_memalign___m128i(0x10,(long)iVar24);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar24);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar24);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr = parasail_memalign___m128i(0x10,(long)iVar24);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar24);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar24);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar24);
      ptr_06 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar33[0] = (long)iVar24;
        alVar33[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar33,len);
        c[0] = (long)iVar24;
        c[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,c,len);
        c_00[0] = (long)iVar24;
        c_00[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,c_00,len);
        c_01[0] = (long)iVar24;
        c_01[1] = extraout_RDX_02;
        parasail_memset___m128i(b,c_01,len);
        c_02[0] = (long)iVar24;
        c_02[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c_02,len);
        c_03[0] = (long)iVar24;
        c_03[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_03,len);
        c_04[0] = (ulong)iVar24;
        c_04[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_04,len);
        vGapperL[1]._0_4_ = -open;
        vGapperL[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        _segNum = 0x100000001;
        vGapperL[0] = 0x100000001;
        k = iVar24;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = CONCAT44(vGapperL[1]._4_4_,(int)vGapperL[1]);
          ptr_04[k][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          vGapperL[1]._0_4_ = (int)vGapperL[1] - gap;
          vGapperL[1]._4_4_ = vGapperL[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
          local_738 = (int)_segNum;
          iStack_734 = (int)((ulong)_segNum >> 0x20);
          iStack_730 = (int)vGapperL[0];
          iStack_72c = (int)((ulong)vGapperL[0] >> 0x20);
          _segNum = CONCAT44(iStack_734 + 1,local_738 + 1);
          vGapperL[0] = CONCAT44(iStack_72c + 1,iStack_730 + 1);
        }
        local_b0c = 0;
        uVar29 = extraout_RDX_06;
        for (k = 0; k < iVar24; k = k + 1) {
          for (local_b10 = 0; local_b10 < 4; local_b10 = local_b10 + 1) {
            uVar28 = local_b10 * iVar24 + k;
            uVar29 = (ulong)uVar28;
            local_de8 = -(gap * uVar28) - open;
            if (local_de8 < -0x80000000) {
              local_de8 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)local_b10 * 4) = local_de8;
          }
          ptr[local_b0c][0] = tmp;
          ptr[local_b0c][1] = h.m[0];
          local_b0c = local_b0c + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_df0 = (ulong)(-(gap * (k + -1)) - open);
          if ((long)local_df0 < -0x80000000) {
            local_df0 = 0xffffffff80000000;
          }
          uVar29 = local_df0 & 0xffffffff;
          ptr_06[k] = (int32_t)local_df0;
        }
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          c_04[0] = b_03[iVar24 + -1][0];
          b_06[1] = b_03[iVar24 + -1][1];
          vH_03[0] = b_04[iVar24 + -1][0];
          b_30[1] = b_04[iVar24 + -1][1];
          uVar9 = b_05[iVar24 + -1][0];
          b_42[1] = b_05[iVar24 + -1][1];
          a[0] = (ulong)(uint)ptr_06[s1Len];
          a[1] = 0;
          _mm_insert_epi32_rpl(a,(int)uVar29,s1Len);
          iVar2 = ppVar5->mapper[(byte)s2[s1Len]];
          iVar3 = ppVar5->mapper[(byte)s2[s1Len]];
          lVar31 = (long)s1Len;
          uVar29 = (ulong)(byte)s2[lVar31];
          iVar4 = ppVar5->mapper[uVar29];
          pvW = (__m128i *)(uVar9 << 0x20);
          vHpL[0] = b_42[1] << 0x20 | uVar9 >> 0x20;
          vHpL[1] = vH_03[0] << 0x20;
          vHpS[0] = b_30[1] << 0x20 | vH_03[0] >> 0x20;
          vHpS[1] = c_04[0] << 0x20;
          vHpM[0] = b_06[1] << 0x20 | c_04[0] >> 0x20;
          vHpM[1] = extraout_XMM0_Qa;
          vHp[0] = extraout_XMM0_Qb;
          for (k = 0; k < iVar24; k = k + 1) {
            lVar30 = ptr[k][0];
            lVar10 = ptr[k][1];
            lVar11 = b_03[k][0];
            lVar12 = b_03[k][1];
            lVar13 = b_04[k][0];
            lVar14 = b_04[k][1];
            palVar15 = (__m128i *)b_05[k][0];
            lVar16 = b_05[k][1];
            puVar27 = (undefined8 *)((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar24) * 0x10);
            uVar17 = *puVar27;
            uVar18 = puVar27[1];
            puVar27 = (undefined8 *)((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar24) * 0x10);
            uVar19 = *puVar27;
            uVar20 = puVar27[1];
            puVar27 = (undefined8 *)((long)pvVar8 + (long)k * 0x10 + (long)(iVar4 * iVar24) * 0x10);
            uVar21 = *puVar27;
            uVar22 = puVar27[1];
            b_06[1] = (long)k * 0x10;
            a_00[1] = lVar31;
            a_00[0] = a[0];
            b_06[0] = uVar29;
            alVar33 = _mm_max_epi32_rpl(a_00,b_06);
            b_07[0] = alVar33[1];
            a_01[1] = lVar31;
            a_01[0] = a[0];
            b_07[1] = b_06[1];
            mask[1] = in_R9;
            mask[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_01,b_07,mask);
            b_08[0] = alVar33[1];
            a_02[1] = lVar31;
            a_02[0] = a[0];
            b_08[1] = b_06[1];
            mask_00[1] = in_R9;
            mask_00[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_02,b_08,mask_00);
            b_09[0] = alVar33[1];
            a_03[1] = lVar31;
            a_03[0] = a[0];
            b_09[1] = b_06[1];
            mask_01[1] = in_R9;
            mask_01[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_03,b_09,mask_01);
            b_10[0] = alVar33[1];
            local_758 = (int)extraout_XMM0_Qa_03;
            iStack_754 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
            iStack_750 = (int)extraout_XMM0_Qb_03;
            iStack_74c = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
            vHt[1] = CONCAT44(iStack_754 + 1,local_758 + 1);
            vEL[0] = CONCAT44(iStack_74c + 1,iStack_750 + 1);
            a_04[1] = lVar31;
            a_04[0] = a[0];
            b_10[1] = b_06[1];
            alVar33 = _mm_max_epi32_rpl(a_04,b_10);
            b_11[0] = alVar33[1];
            a_05[1] = lVar31;
            a_05[0] = a[0];
            b_11[1] = b_06[1];
            mask_02[1] = in_R9;
            mask_02[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_05,b_11,mask_02);
            b_12[0] = alVar33[1];
            a_06[1] = lVar31;
            a_06[0] = a[0];
            b_12[1] = b_06[1];
            mask_03[1] = in_R9;
            mask_03[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_06,b_12,mask_03);
            b_13[0] = alVar33[1];
            a_07[1] = lVar31;
            a_07[0] = a[0];
            b_13[1] = b_06[1];
            mask_04[1] = in_R9;
            mask_04[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_07,b_13,mask_04);
            b_14[0] = alVar33[1];
            local_7b8 = (int)vHpM[1];
            iStack_7b4 = (int)((ulong)vHpM[1] >> 0x20);
            iStack_7b0 = (int)vHp[0];
            iStack_7ac = (int)((ulong)vHp[0] >> 0x20);
            local_7c8 = (int)uVar17;
            iStack_7c4 = (int)((ulong)uVar17 >> 0x20);
            iStack_7c0 = (int)uVar18;
            iStack_7bc = (int)((ulong)uVar18 >> 0x20);
            vHpM[1] = CONCAT44(iStack_7b4 + iStack_7c4,local_7b8 + local_7c8);
            vHp[0] = CONCAT44(iStack_7ac + iStack_7bc,iStack_7b0 + iStack_7c0);
            local_7d8 = (int)vHpS[1];
            iStack_7d4 = (int)((ulong)vHpS[1] >> 0x20);
            iStack_7d0 = (int)vHpM[0];
            iStack_7cc = (int)((ulong)vHpM[0] >> 0x20);
            local_7e8 = (int)uVar19;
            iStack_7e4 = (int)((ulong)uVar19 >> 0x20);
            iStack_7e0 = (int)uVar20;
            iStack_7dc = (int)((ulong)uVar20 >> 0x20);
            vHpS[1] = CONCAT44(iStack_7d4 + iStack_7e4,local_7d8 + local_7e8);
            vHpM[0] = CONCAT44(iStack_7cc + iStack_7dc,iStack_7d0 + iStack_7e0);
            local_7f8 = (int)vHpL[1];
            iStack_7f4 = (int)((ulong)vHpL[1] >> 0x20);
            iStack_7f0 = (int)vHpS[0];
            iStack_7ec = (int)((ulong)vHpS[0] >> 0x20);
            local_808 = (int)uVar21;
            iStack_804 = (int)((ulong)uVar21 >> 0x20);
            iStack_800 = (int)uVar22;
            iStack_7fc = (int)((ulong)uVar22 >> 0x20);
            vHpL[1] = CONCAT44(iStack_7f4 + iStack_804,local_7f8 + local_808);
            vHpS[0] = CONCAT44(iStack_7ec + iStack_7fc,iStack_7f0 + iStack_800);
            local_818 = (int)pvW;
            iStack_814 = (int)((ulong)pvW >> 0x20);
            iStack_810 = (int)vHpL[0];
            iStack_80c = (int)((ulong)vHpL[0] >> 0x20);
            pvW = (__m128i *)CONCAT44(iStack_814 + 1,local_818 + 1);
            vHpL[0] = CONCAT44(iStack_80c + 1,iStack_810 + 1);
            a_08[1] = lVar31;
            a_08[0] = a[0];
            b_14[1] = b_06[1];
            alVar33 = _mm_max_epi32_rpl(a_08,b_14);
            b_15[0] = alVar33[1];
            a_09[1] = lVar31;
            a_09[0] = a[0];
            b_15[1] = b_06[1];
            mask_05[1] = in_R9;
            mask_05[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_09,b_15,mask_05);
            b_16[0] = alVar33[1];
            a_10[1] = lVar31;
            a_10[0] = a[0];
            b_16[1] = b_06[1];
            mask_06[1] = in_R9;
            mask_06[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_10,b_16,mask_06);
            b_17[0] = alVar33[1];
            a_11[1] = lVar31;
            a_11[0] = a[0];
            b_17[1] = b_06[1];
            mask_07[1] = in_R9;
            mask_07[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_11,b_17,mask_07);
            uVar29 = alVar33[1];
            b[k][0] = extraout_XMM0_Qa_00;
            b[k][1] = extraout_XMM0_Qb_00;
            b_00[k][0] = extraout_XMM0_Qa_01;
            b_00[k][1] = extraout_XMM0_Qb_01;
            b_01[k][0] = extraout_XMM0_Qa_02;
            b_01[k][1] = extraout_XMM0_Qb_02;
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            pvW = palVar15;
            vHpL[0] = lVar16;
            vHpL[1] = lVar13;
            vHpS[0] = lVar14;
            vHpS[1] = lVar11;
            vHpM[0] = lVar12;
            vHpM[1] = lVar30;
            vHp[0] = lVar10;
          }
          b_06[1] = (long)s1Len;
          a_12[0] = (int *)(ulong)(uint)ptr_06[b_06[1] + 1];
          vH_03[0] = 0;
          a_12[1] = 0;
          alVar33 = _mm_insert_epi32_rpl(a_12,(int32_t)uVar29,s1Len);
          b_18[0] = alVar33[1];
          a_13[1] = vH_03[0];
          a_13[0] = (longlong)a_12[0];
          b_18[1] = b_06[1];
          alVar33 = _mm_max_epi32_rpl(a_13,b_18);
          b_19[0] = alVar33[1];
          a_14[1] = vH_03[0];
          a_14[0] = (longlong)a_12[0];
          b_19[1] = b_06[1];
          mask_08[1] = in_R9;
          mask_08[0] = uVar32;
          alVar33 = _mm_blendv_epi8_rpl(a_14,b_19,mask_08);
          b_20[0] = alVar33[1];
          a_15[1] = vH_03[0];
          a_15[0] = (longlong)a_12[0];
          b_20[1] = b_06[1];
          mask_09[1] = in_R9;
          mask_09[0] = uVar32;
          alVar33 = _mm_blendv_epi8_rpl(a_15,b_20,mask_09);
          b_21[0] = alVar33[1];
          a_16[1] = vH_03[0];
          a_16[0] = (longlong)a_12[0];
          b_21[1] = b_06[1];
          mask_10[1] = in_R9;
          mask_10[0] = uVar32;
          alVar33 = _mm_blendv_epi8_rpl(a_16,b_21,mask_10);
          lVar30 = alVar33[1];
          for (k = 0; k < 2; k = k + 1) {
            a_17[1] = vH_03[0];
            a_17[0] = (longlong)a_12[0];
            b_22[1]._0_4_ = 2;
            b_22[0] = lVar30;
            b_22[1]._4_4_ = 0;
            lVar30 = 2;
            alVar33 = _mm_max_epi32_rpl(a_17,b_22);
            b_23[0] = alVar33[1];
            a_18[1] = vH_03[0];
            a_18[0] = (longlong)a_12[0];
            b_23[1] = lVar30;
            mask_11[1] = in_R9;
            mask_11[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_18,b_23,mask_11);
            b_24[0] = alVar33[1];
            a_19[1] = vH_03[0];
            a_19[0] = (longlong)a_12[0];
            b_24[1] = lVar30;
            mask_12[1] = in_R9;
            mask_12[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_19,b_24,mask_12);
            b_25[0] = alVar33[1];
            a_20[1] = vH_03[0];
            a_20[0] = (longlong)a_12[0];
            b_25[1] = lVar30;
            mask_13[1] = in_R9;
            mask_13[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_20,b_25,mask_13);
            lVar30 = alVar33[1];
          }
          a_21[1] = vH_03[0];
          a_21[0] = (longlong)a_12[0];
          b_26[1]._0_4_ = 2;
          b_26[0] = lVar30;
          b_26[1]._4_4_ = 0;
          lVar30 = 2;
          alVar33 = _mm_max_epi32_rpl(a_21,b_26);
          b_27[0] = alVar33[1];
          a_22[1] = vH_03[0];
          a_22[0] = (longlong)a_12[0];
          b_27[1] = lVar30;
          mask_14[1] = in_R9;
          mask_14[0] = uVar32;
          alVar33 = _mm_blendv_epi8_rpl(a_22,b_27,mask_14);
          b_28[0] = alVar33[1];
          a_23[1] = vH_03[0];
          a_23[0] = (longlong)a_12[0];
          b_28[1] = lVar30;
          mask_15[1] = in_R9;
          mask_15[0] = uVar32;
          alVar33 = _mm_blendv_epi8_rpl(a_23,b_28,mask_15);
          b_29[0] = alVar33[1];
          a_24[1] = vH_03[0];
          a_24[0] = (longlong)a_12[0];
          b_29[1] = lVar30;
          mask_16[1] = in_R9;
          mask_16[0] = uVar32;
          alVar33 = _mm_blendv_epi8_rpl(a_24,b_29,mask_16);
          uVar29 = alVar33[1];
          for (k = 0; k < iVar24; k = k + 1) {
            b_30[1] = (long)k * 0x10;
            a_25[1] = vH_03[0];
            a_25[0] = (longlong)a_12[0];
            b_30[0] = uVar29;
            alVar33 = _mm_max_epi32_rpl(a_25,b_30);
            b_31[0] = alVar33[1];
            a_26[1] = vH_03[0];
            a_26[0] = (longlong)a_12[0];
            b_31[1] = b_30[1];
            mask_17[1] = in_R9;
            mask_17[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_26,b_31,mask_17);
            b_32[0] = alVar33[1];
            a_27[1] = vH_03[0];
            a_27[0] = (longlong)a_12[0];
            b_32[1] = b_30[1];
            mask_18[1] = in_R9;
            mask_18[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_27,b_32,mask_18);
            b_33[0] = alVar33[1];
            a_28[1] = vH_03[0];
            a_28[0] = (longlong)a_12[0];
            b_33[1] = b_30[1];
            mask_19[1] = in_R9;
            mask_19[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_28,b_33,mask_19);
            b_34[0] = alVar33[1];
            a_29[1] = vH_03[0];
            a_29[0] = (longlong)a_12[0];
            b_34[1] = b_30[1];
            alVar33 = _mm_max_epi32_rpl(a_29,b_34);
            b_35[0] = alVar33[1];
            a_30[1] = vH_03[0];
            a_30[0] = (longlong)a_12[0];
            b_35[1] = b_30[1];
            alVar33 = _mm_max_epi32_rpl(a_30,b_35);
            b_36[0] = alVar33[1];
            a_31[1] = vH_03[0];
            a_31[0] = (longlong)a_12[0];
            b_36[1] = b_30[1];
            mask_20[1] = in_R9;
            mask_20[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_31,b_36,mask_20);
            b_37[0] = alVar33[1];
            a_32[1] = vH_03[0];
            a_32[0] = (longlong)a_12[0];
            b_37[1] = b_30[1];
            mask_21[1] = in_R9;
            mask_21[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_32,b_37,mask_21);
            b_38[0] = alVar33[1];
            a_33[1] = vH_03[0];
            a_33[0] = (longlong)a_12[0];
            b_38[1] = b_30[1];
            mask_22[1] = in_R9;
            mask_22[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_33,b_38,mask_22);
            b_39[0] = alVar33[1];
            a_34[1] = vH_03[0];
            a_34[0] = (longlong)a_12[0];
            b_39[1] = b_30[1];
            mask_23[1] = in_R9;
            mask_23[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_34,b_39,mask_23);
            b_40[0] = alVar33[1];
            a_35[1] = vH_03[0];
            a_35[0] = (longlong)a_12[0];
            b_40[1] = b_30[1];
            mask_24[1] = in_R9;
            mask_24[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_35,b_40,mask_24);
            b_41[0] = alVar33[1];
            a_36[1] = vH_03[0];
            a_36[0] = (longlong)a_12[0];
            b_41[1] = b_30[1];
            mask_25[1] = in_R9;
            mask_25[0] = uVar32;
            alVar33 = _mm_blendv_epi8_rpl(a_36,b_41,mask_25);
            b_42[0] = alVar33[1];
            ptr[k][0] = extraout_XMM0_Qa_04;
            ptr[k][1] = extraout_XMM0_Qb_04;
            b_03[k][0] = extraout_XMM0_Qa_05;
            b_03[k][1] = extraout_XMM0_Qb_05;
            b_04[k][0] = extraout_XMM0_Qa_06;
            b_04[k][1] = extraout_XMM0_Qb_06;
            b_42[1] = (long)k * 0x10;
            b_05[k][0] = extraout_XMM0_Qa_07;
            b_05[k][1] = extraout_XMM0_Qb_07;
            a_37[1] = vH_03[0];
            a_37[0] = (longlong)a_12[0];
            alVar33 = _mm_min_epi32_rpl(a_37,b_42);
            b_43[0] = alVar33[1];
            a_38[1] = vH_03[0];
            a_38[0] = (longlong)a_12[0];
            b_43[1] = b_42[1];
            alVar33 = _mm_max_epi32_rpl(a_38,b_43);
            b_44[0] = alVar33[1];
            a_39[1] = vH_03[0];
            a_39[0] = (longlong)a_12[0];
            b_44[1] = b_42[1];
            alVar33 = _mm_max_epi32_rpl(a_39,b_44);
            b_45[0] = alVar33[1];
            a_40[1] = vH_03[0];
            a_40[0] = (longlong)a_12[0];
            b_45[1] = b_42[1];
            alVar33 = _mm_max_epi32_rpl(a_40,b_45);
            b_46[0] = alVar33[1];
            a_41[1] = vH_03[0];
            a_41[0] = (longlong)a_12[0];
            b_46[1] = b_42[1];
            _mm_max_epi32_rpl(a_41,b_46);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar24;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                             &profile_local->matrix)->trace->trace_del_table,vH_00,s1Len,s2Len,
                            (int32_t)in_R9,in_stack_fffffffffffff208);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar24;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 8),
                            vH_01,s1Len,s2Len,(int32_t)in_R9,in_stack_fffffffffffff208);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar24;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x10),
                            vH_02,s1Len,s2Len,(int32_t)in_R9,in_stack_fffffffffffff208);
            a_12[0] = *(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                      &profile_local->matrix)->trace->trace_del_table + 0x18);
            vH_03[0] = (ulong)(uint)k;
            uVar32 = (ulong)(uint)s2Len;
            vH_03[1]._0_4_ = iVar24;
            vH_03[1]._4_4_ = 0;
            arr_store_si128(a_12[0],vH_03,s1Len,s2Len,(int32_t)in_R9,in_stack_fffffffffffff208);
            uVar29 = extraout_RDX_07;
            vNegInfFront[1] = extraout_XMM0_Qa_09;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_09;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_08;
            vSaturationCheckMin[0] = extraout_XMM0_Qb_08;
          }
          c_04[0] = vH_03[0];
        }
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar24) + 4U);
            end_query = end_query + 1) {
        }
        a_42[1] = c_04[0];
        a_42[0] = 3;
        similar = _mm_extract_epi32_rpl(a_42,(int)uVar29);
        a_43[1] = c_04[0];
        a_43[0] = 3;
        length = _mm_extract_epi32_rpl(a_43,imm);
        a_44[1] = c_04[0];
        a_44[0] = 3;
        vNegLimit[1]._4_4_ = _mm_extract_epi32_rpl(a_44,imm_00);
        a_45[1] = c_04[0];
        a_45[0] = 3;
        vNegLimit[1]._0_4_ = _mm_extract_epi32_rpl(a_45,imm_01);
        local_108 = (int)vSaturationCheckMax[1];
        iStack_104 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_100 = (int)vSaturationCheckMin[0];
        iStack_fc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_348 = (int)vNegInfFront[1];
        iStack_344 = (int)((ulong)vNegInfFront[1] >> 0x20);
        iStack_340 = (int)vSaturationCheckMax[0];
        iStack_33c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar32 = CONCAT44(-(uint)(iStack_fc < (int)uVar25),-(uint)(iStack_100 < (int)uVar25)) |
                 CONCAT44(-(uint)(iVar26 < iStack_33c),-(uint)(iVar26 < iStack_340));
        auVar23._8_8_ = uVar32;
        auVar23._0_8_ =
             CONCAT44(-(uint)(iStack_104 < (int)uVar25),-(uint)(local_108 < (int)uVar25)) |
             CONCAT44(-(uint)(iVar26 < iStack_344),-(uint)(iVar26 < local_348));
        if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar32 >> 7 & 1) != 0) || (uVar32 >> 0xf & 1) != 0) || (uVar32 >> 0x17 & 1) != 0)
               || (uVar32 >> 0x1f & 1) != 0) || (uVar32 >> 0x27 & 1) != 0) ||
             (uVar32 >> 0x2f & 1) != 0) || (uVar32 >> 0x37 & 1) != 0) || (long)uVar32 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          similar = 0;
          length = 0;
          vNegLimit[1]._4_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          local_950 = 0;
          matrix._4_4_ = 0;
        }
        *(int32_t *)&profile_local->s1 = similar;
        *(int *)((long)&profile_local->s1 + 4) = local_950;
        profile_local->s1Len = matrix._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->matches =
             length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             vNegLimit[1]._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int32_t)vNegLimit[1];
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32_rpl(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32_rpl(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32_rpl(vHp, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        matches = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
        similar = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
        length = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}